

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

ssize_t nw_in_read(void *reader_ctx,uchar *buf,size_t len,CURLcode *err)

{
  long lVar1;
  Curl_easy *data;
  int *piVar2;
  char *pcVar3;
  char local_148 [8];
  char buffer [256];
  ulong uStack_40;
  int sockerr;
  ssize_t nread;
  cf_socket_ctx *ctx;
  reader_ctx *rctx;
  CURLcode *err_local;
  size_t len_local;
  uchar *buf_local;
  void *reader_ctx_local;
  
  lVar1 = *(long *)(*reader_ctx + 0x10);
  *err = CURLE_OK;
  uStack_40 = recv(*(int *)(lVar1 + 0x98),buf,len,0);
  if (uStack_40 == 0xffffffffffffffff) {
    piVar2 = __errno_location();
    buffer._252_4_ = *piVar2;
    if (((buffer._252_4_ == 0xb) || (buffer._252_4_ == 0xb)) || (buffer._252_4_ == 4)) {
      *err = CURLE_AGAIN;
    }
    else {
      data = *(Curl_easy **)((long)reader_ctx + 8);
      pcVar3 = Curl_strerror(buffer._252_4_,local_148,0x100);
      Curl_failf(data,"Recv failure: %s",pcVar3);
      *(undefined4 *)(*(long *)((long)reader_ctx + 8) + 0xd0c) = buffer._252_4_;
      *err = CURLE_RECV_ERROR;
    }
    uStack_40 = 0xffffffffffffffff;
  }
  if (((*(long *)((long)reader_ctx + 8) != 0) &&
      ((*(ulong *)(*(long *)((long)reader_ctx + 8) + 0xa52) >> 0x1c & 1) != 0)) &&
     ((*reader_ctx != 0 && (0 < *(int *)(**reader_ctx + 0xc))))) {
    Curl_trc_cf_infof(*(Curl_easy **)((long)reader_ctx + 8),*reader_ctx,
                      "nw_in_read(len=%zu) -> %d, err=%d",len,uStack_40 & 0xffffffff,(ulong)*err);
  }
  return uStack_40;
}

Assistant:

static ssize_t nw_in_read(void *reader_ctx,
                           unsigned char *buf, size_t len,
                           CURLcode *err)
{
  struct reader_ctx *rctx = reader_ctx;
  struct cf_socket_ctx *ctx = rctx->cf->ctx;
  ssize_t nread;

  *err = CURLE_OK;
  nread = sread(ctx->sock, buf, len);

  if(-1 == nread) {
    int sockerr = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == sockerr)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == sockerr) || (EAGAIN == sockerr) || (EINTR == sockerr)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *err = CURLE_AGAIN;
      nread = -1;
    }
    else {
      char buffer[STRERROR_LEN];

      failf(rctx->data, "Recv failure: %s",
            Curl_strerror(sockerr, buffer, sizeof(buffer)));
      rctx->data->state.os_errno = sockerr;
      *err = CURLE_RECV_ERROR;
      nread = -1;
    }
  }
  CURL_TRC_CF(rctx->data, rctx->cf, "nw_in_read(len=%zu) -> %d, err=%d",
              len, (int)nread, *err);
  return nread;
}